

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O0

void Llb_ManFlowUpdateCut(Aig_Man_t *p,Vec_Ptr_t *vMinCut)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vMinCut_local;
  Aig_Man_t *p_local;
  
  Aig_ManIncrementTravId(p);
  for (local_24 = 0; iVar1 = Vec_PtrSize(vMinCut), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vMinCut,local_24);
    Llb_ManFlowLabelTfi_rec(p,pAVar2);
  }
  Vec_PtrClear(vMinCut);
  Aig_ManIncrementTravId(p);
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_24);
    if (((pAVar2 != (Aig_Obj_t *)0x0) &&
        (((iVar1 = Aig_ObjIsCo(pAVar2), iVar1 != 0 || (iVar1 = Aig_ObjIsNode(pAVar2), iVar1 != 0))
         && (iVar1 = Aig_ObjIsTravIdCurrent(p,pAVar2), iVar1 == 0)))) &&
       (iVar1 = Aig_ObjIsTravIdPrevious(p,pAVar2), iVar1 == 0)) {
      pAVar3 = Aig_ObjFanin0(pAVar2);
      iVar1 = Aig_ObjIsTravIdPrevious(p,pAVar3);
      if (iVar1 != 0) {
        pAVar3 = Aig_ObjFanin0(pAVar2);
        Aig_ObjSetTravIdCurrent(p,pAVar3);
        pAVar3 = Aig_ObjFanin0(pAVar2);
        Vec_PtrPush(vMinCut,pAVar3);
      }
      iVar1 = Aig_ObjIsNode(pAVar2);
      if (iVar1 != 0) {
        pAVar3 = Aig_ObjFanin1(pAVar2);
        iVar1 = Aig_ObjIsTravIdPrevious(p,pAVar3);
        if (iVar1 != 0) {
          pAVar3 = Aig_ObjFanin1(pAVar2);
          Aig_ObjSetTravIdCurrent(p,pAVar3);
          pAVar2 = Aig_ObjFanin1(pAVar2);
          Vec_PtrPush(vMinCut,pAVar2);
        }
      }
    }
  }
  return;
}

Assistant:

void Llb_ManFlowUpdateCut( Aig_Man_t * p, Vec_Ptr_t * vMinCut )
{
    Aig_Obj_t * pObj;
    int i;
    // label the TFI of the cut nodes
    Aig_ManIncrementTravId(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, vMinCut, pObj, i )
        Llb_ManFlowLabelTfi_rec( p, pObj );
    // collect labeled fanins of non-labeled nodes
    Vec_PtrClear( vMinCut );
    Aig_ManIncrementTravId(p);
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !Aig_ObjIsCo(pObj) && !Aig_ObjIsNode(pObj) )
            continue;
        if ( Aig_ObjIsTravIdCurrent(p, pObj) || Aig_ObjIsTravIdPrevious(p, pObj) )
            continue;
        if ( Aig_ObjIsTravIdPrevious(p, Aig_ObjFanin0(pObj)) )
        {
            Aig_ObjSetTravIdCurrent(p, Aig_ObjFanin0(pObj));
            Vec_PtrPush( vMinCut, Aig_ObjFanin0(pObj) );
        }
        if ( Aig_ObjIsNode(pObj) && Aig_ObjIsTravIdPrevious(p, Aig_ObjFanin1(pObj)) )
        {
            Aig_ObjSetTravIdCurrent(p, Aig_ObjFanin1(pObj));
            Vec_PtrPush( vMinCut, Aig_ObjFanin1(pObj) );
        }
    }
}